

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

real_t __thiscall xLearn::AUCMetric::GetMetric(AUCMetric *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  real_t rVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000000f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000000f8;
  AUCMetric *in_stack_00000100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(unaff_retaddr,in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(unaff_retaddr,in_RDI);
  rVar1 = CalcAUC(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffc0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffc0);
  return rVar1;
}

Assistant:

real_t GetMetric() {
    return CalcAUC(all_positive_number_, 
                   all_negative_number_);
  }